

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O1

void __thiscall hmi::renderer::draw_circle(renderer *this,vec2f center,float radius,color4f color)

{
  undefined8 *puVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  vertex vertices [50];
  float local_508;
  float fStack_504;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  vertex local_4c8 [50];
  
  puVar1 = (undefined8 *)((long)&local_4c8[0].color.field_0 + 8);
  lVar2 = 0;
  do {
    fVar3 = ((float)(int)lVar2 * 6.2831855) / 50.0;
    fVar4 = sinf(fVar3);
    fVar3 = cosf(fVar3);
    local_508 = center.field_0._0_4_;
    fStack_504 = center.field_0._4_4_;
    puVar1[-2] = CONCAT44(fVar3 * radius + fStack_504,fVar4 * radius + local_508);
    local_4e8 = color.field_0._0_8_;
    uStack_4e0 = color.field_0._8_8_;
    *(undefined8 *)&((color4f *)(puVar1 + -1))->field_0 = local_4e8;
    *puVar1 = uStack_4e0;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 3;
  } while (lVar2 != 0x32);
  draw(this,local_4c8,0x32,2);
  return;
}

Assistant:

void renderer::draw_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT];

    for (int i = 0; i < POINT_COUNT; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i].color = color;
    }

    draw(&vertices[0], POINT_COUNT, GL_LINE_LOOP);
  }